

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase309::run(TestCase309 *this)

{
  Builder builder_00;
  Reader reader_00;
  bool bVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> packedBytes;
  ReaderOptions options;
  undefined8 in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  Reader local_388;
  ArrayPtr<capnp::word> local_358;
  ReaderOptions local_348;
  undefined1 local_330 [8];
  PackedMessageReader reader;
  size_t local_1e8;
  size_t local_1e0;
  bool local_1d1;
  undefined1 auStack_1d0 [7];
  bool _kj_shouldLog;
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  DebugExpression<unsigned_long> local_1b0;
  undefined1 local_1a8 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  TestPipe pipe;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase309 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,7);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_130,(MessageBuilder *)local_108);
  builder_00._builder.capTable = (CapTableBuilder *)local_130._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_130._builder.capTable;
  builder_00._builder.data = local_130._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_130._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffc20;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc20 >> 0x30);
  initTestMessage(builder_00);
  TestPipe::TestPipe((TestPipe *)&_kjCondition.result,1);
  writePackedMessage((OutputStream *)&pipe,(MessageBuilder *)local_108);
  local_1b8 = computeSerializedSizeInWords((MessageBuilder *)local_108);
  local_1b0 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1b8);
  _auStack_1d0 = TestPipe::getArray((TestPipe *)&_kjCondition.result);
  AVar2.size_ = (uchar *)auStack_1d0._8_8_;
  AVar2.ptr = AVar2.size_;
  local_1c0 = computeUnpackedSizeInWords((capnp *)auStack_1d0._0_8_,AVar2);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_1a8,&local_1b0,&local_1c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
  if (!bVar1) {
    local_1d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d1 != false) {
      local_1e0 = computeSerializedSizeInWords((MessageBuilder *)local_108);
      AVar2 = TestPipe::getArray((TestPipe *)&_kjCondition.result);
      packedBytes.size_ = (uchar *)AVar2.size_;
      reader.super_InputStreamMessageReader._288_8_ = AVar2.ptr;
      packedBytes.ptr = packedBytes.size_;
      in_stack_fffffffffffffc28 =
           computeUnpackedSizeInWords
                     ((capnp *)reader.super_InputStreamMessageReader._288_8_,packedBytes);
      local_1e8 = in_stack_fffffffffffffc28;
      kj::_::Debug::
      log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
                 ,0x13c,ERROR,
                 "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
                 ,(char (*) [106])
                  "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)local_1a8,&local_1e0,&local_1e8);
      local_1d1 = false;
    }
  }
  local_348.traversalLimitInWords = 0;
  local_348.nestingLimit = 0;
  local_348._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_348);
  kj::ArrayPtr<capnp::word>::ArrayPtr(&local_358,(void *)0x0);
  options.nestingLimit = local_348.nestingLimit;
  options.traversalLimitInWords = local_348.traversalLimitInWords;
  options._12_4_ = 0;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)local_330,(BufferedInputStream *)&_kjCondition.result,options,
             local_358);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_388,(MessageReader *)&reader.super_PackedInputStream.inner);
  reader_00._reader.capTable = (CapTableReader *)local_388._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_388._reader.capTable;
  reader_00._reader.data = local_388._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_388._reader._32_8_;
  reader_00._reader.dataSize = local_388._reader.nestingLimit;
  reader_00._reader.pointerCount = local_388._reader._44_2_;
  reader_00._reader._38_2_ = local_388._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffc28;
  checkTestMessage(reader_00);
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_330);
  TestPipe::~TestPipe((TestPipe *)&_kjCondition.result);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Packed, RoundTripOddSegmentCountLazy) {
  TestMessageBuilder builder(7);
  initTestMessage(builder.initRoot<TestAllTypes>());

  TestPipe pipe(1);
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessage(reader.getRoot<TestAllTypes>());
}